

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# put.cpp
# Opt level: O0

matrix * __thiscall put::option_Crank_Nicolson(matrix *__return_storage_ptr__,put *this,int m,int n)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  __type _Var7;
  double local_2d0;
  double local_2a8;
  double local_210;
  matrix local_f8;
  matrix local_e0;
  matrix local_c8;
  undefined1 local_a9;
  undefined1 local_a8 [8];
  matrix C;
  undefined1 local_80 [8];
  matrix B;
  matrix A;
  int k;
  int i;
  double nu;
  double lambda;
  double dt;
  double h;
  double s;
  int n_local;
  int m_local;
  put *this_local;
  matrix *P;
  
  dVar3 = (this->super_payoff).L_ / (double)m;
  dVar4 = (this->super_payoff).T_ / (double)n;
  dVar5 = dVar4 / dVar3;
  dVar6 = dVar4 / (dVar3 * dVar3);
  matrix::matrix((matrix *)&B.data_,m + 1,m + 1);
  matrix::matrix((matrix *)local_80,m + 1,m + 1);
  matrix::matrix((matrix *)local_a8,m + 1,m + 1);
  local_a9 = 0;
  matrix::matrix(__return_storage_ptr__,m + 1,1);
  dVar1 = (this->super_payoff).K_;
  pdVar2 = matrix::operator()(__return_storage_ptr__,0,0);
  *pdVar2 = dVar1;
  dVar1 = (this->super_payoff).r_;
  pdVar2 = matrix::operator()((matrix *)&B.data_,0,0);
  *pdVar2 = dVar1 * dVar4 * 0.5 + 1.0;
  dVar1 = (this->super_payoff).r_;
  pdVar2 = matrix::operator()((matrix *)local_80,0,0);
  *pdVar2 = dVar1 * dVar4 * -0.5 + 1.0;
  for (A.data_._4_4_ = 1; A.data_._4_4_ < m; A.data_._4_4_ = A.data_._4_4_ + 1) {
    local_210 = (double)A.data_._4_4_ * dVar3;
    dVar1 = (this->super_payoff).r_;
    _Var7 = std::pow<double,int>((this->super_payoff).sigma_ * local_210,2);
    pdVar2 = matrix::operator()((matrix *)&B.data_,A.data_._4_4_,A.data_._4_4_ + -1);
    *pdVar2 = dVar1 * 0.25 * local_210 * dVar5 + _Var7 * -0.25 * dVar6;
    _Var7 = std::pow<double,int>((this->super_payoff).sigma_ * local_210,2);
    dVar1 = (this->super_payoff).r_;
    pdVar2 = matrix::operator()((matrix *)&B.data_,A.data_._4_4_,A.data_._4_4_);
    *pdVar2 = dVar1 * dVar4 * 5.0 + _Var7 * dVar6 * 0.5 + 1.0;
    dVar1 = (this->super_payoff).r_;
    _Var7 = std::pow<double,int>((this->super_payoff).sigma_ * local_210,2);
    pdVar2 = matrix::operator()((matrix *)&B.data_,A.data_._4_4_,A.data_._4_4_ + 1);
    *pdVar2 = dVar1 * -0.25 * local_210 * dVar5 + _Var7 * -0.25 * dVar6;
    dVar1 = (this->super_payoff).r_;
    _Var7 = std::pow<double,int>((this->super_payoff).sigma_ * local_210,2);
    pdVar2 = matrix::operator()((matrix *)local_80,A.data_._4_4_,A.data_._4_4_ + -1);
    *pdVar2 = dVar1 * -0.25 * local_210 * dVar5 + _Var7 * 0.25 * dVar6;
    _Var7 = std::pow<double,int>((this->super_payoff).sigma_ * local_210,2);
    dVar1 = (this->super_payoff).r_;
    pdVar2 = matrix::operator()((matrix *)local_80,A.data_._4_4_,A.data_._4_4_);
    *pdVar2 = _Var7 * dVar6 * -0.5 + 1.0 + dVar1 * dVar4 * -5.0;
    dVar1 = (this->super_payoff).r_;
    _Var7 = std::pow<double,int>((this->super_payoff).sigma_ * local_210,2);
    pdVar2 = matrix::operator()((matrix *)local_80,A.data_._4_4_,A.data_._4_4_ + 1);
    *pdVar2 = _Var7 * 0.25 * dVar6 + dVar1 * local_210 * dVar5 * 0.25;
    if ((this->super_payoff).K_ - local_210 <= 0.0) {
      local_210 = 0.0;
    }
    else {
      local_210 = (this->super_payoff).K_ - local_210;
    }
    pdVar2 = matrix::operator()(__return_storage_ptr__,A.data_._4_4_,0);
    *pdVar2 = local_210;
  }
  dVar3 = (double)m * dVar3;
  dVar1 = (this->super_payoff).r_;
  _Var7 = std::pow<double,int>((this->super_payoff).sigma_ * dVar3,2);
  pdVar2 = matrix::operator()((matrix *)&B.data_,m,m + -1);
  *pdVar2 = dVar1 * 0.25 * dVar3 * dVar5 + _Var7 * -0.25 * dVar6;
  _Var7 = std::pow<double,int>((this->super_payoff).sigma_ * dVar3,2);
  dVar1 = (this->super_payoff).r_;
  pdVar2 = matrix::operator()((matrix *)&B.data_,m,m);
  *pdVar2 = dVar1 * dVar4 * 0.5 + _Var7 * dVar6 * 0.5 + 1.0;
  dVar1 = (this->super_payoff).r_;
  _Var7 = std::pow<double,int>((this->super_payoff).sigma_ * dVar3,2);
  pdVar2 = matrix::operator()((matrix *)local_80,m,m + -1);
  *pdVar2 = dVar1 * -0.25 * dVar3 * dVar5 + _Var7 * 0.25 * dVar6;
  _Var7 = std::pow<double,int>((this->super_payoff).sigma_ * dVar3,2);
  dVar1 = (this->super_payoff).r_;
  pdVar2 = matrix::operator()((matrix *)local_80,m,m);
  *pdVar2 = (1.0 - _Var7 * dVar6 * 0.5) - dVar1 * dVar4 * 0.5;
  if ((this->super_payoff).K_ - dVar3 <= 0.0) {
    local_2a8 = 0.0;
  }
  else {
    local_2a8 = (this->super_payoff).K_ - dVar3;
  }
  pdVar2 = matrix::operator()(__return_storage_ptr__,m,0);
  *pdVar2 = local_2a8;
  inverse(&local_c8,(matrix *)&B.data_);
  matrix::operator=((matrix *)local_a8,&local_c8);
  matrix::~matrix(&local_c8);
  mul(&local_e0,(matrix *)local_a8,(matrix *)local_80);
  matrix::operator=((matrix *)local_a8,&local_e0);
  matrix::~matrix(&local_e0);
  for (A.data_._0_4_ = 1; (int)A.data_ <= n; A.data_._0_4_ = (int)A.data_ + 1) {
    mul(&local_f8,(matrix *)local_a8,__return_storage_ptr__);
    matrix::operator=(__return_storage_ptr__,&local_f8);
    matrix::~matrix(&local_f8);
    pdVar2 = matrix::operator()(__return_storage_ptr__,m,0);
    *pdVar2 = 0.0;
    dVar1 = (this->super_payoff).K_;
    dVar5 = exp(-(this->super_payoff).r_ * (-(double)(int)A.data_ * dVar4 + (this->super_payoff).T_)
               );
    if (dVar1 * dVar5 + -dVar3 <= 0.0) {
      local_2d0 = 0.0;
    }
    else {
      dVar1 = (this->super_payoff).K_;
      dVar5 = exp(-(this->super_payoff).r_ *
                  (-(double)(int)A.data_ * dVar4 + (this->super_payoff).T_));
      local_2d0 = dVar1 * dVar5 + -dVar3;
    }
    pdVar2 = matrix::operator()(__return_storage_ptr__,0,0);
    *pdVar2 = local_2d0;
  }
  local_a9 = 1;
  matrix::~matrix((matrix *)local_a8);
  matrix::~matrix((matrix *)local_80);
  matrix::~matrix((matrix *)&B.data_);
  return __return_storage_ptr__;
}

Assistant:

matrix put::option_Crank_Nicolson(int m, int n){
    double s;
    double h  = L_/m;
    double dt = T_/n;
    double lambda, nu;
    int i, k;
    lambda = dt/h;
    nu = dt/(h*h);

    matrix A(m + 1, m + 1);
    matrix B(m + 1, m + 1);
    matrix C(m + 1, m + 1);
    matrix P(m + 1, 1);

    P(0, 0) = K_;//price
    A(0, 0) = 1 + r_*dt/2;
    B(0, 0) = 1 - r_*dt/2;
    for(i = 1; i < m; i++){
        s = i * h;
        A(i, i-1) = 0.25*r_*s*lambda - 0.25*pow(sigma_*s, 2)*nu;
        A(i, i) = 1+pow(sigma_*s, 2)*nu*0.5 + r_*dt*05;
        A(i, i+1) = 0.25*-r_*s*lambda - 0.25*pow(sigma_*s, 2)*nu;
        B(i, i-1) = 0.25*-r_*s*lambda + 0.25*pow(sigma_*s, 2)*nu;
        B(i, i) = 1-pow(sigma_*s, 2)*nu*0.5 - r_*dt*05;
        B(i, i+1) = r_*s*lambda/4 + 0.25*pow(sigma_*s, 2)*nu;
        P(i, 0) = ((K_-s > 0) ? (K_-s) : 0);
    }


    s = m*h;
    A(m, m-1) = 0.25*r_*s*lambda-0.25*pow(sigma_*s, 2)*nu;
    A(m, m) = 1+pow(sigma_*s, 2)*nu*0.5+r_*dt*0.5;
    B(m, m-1) = 0.25*-r_*s*lambda+0.25*pow(sigma_*s, 2)*nu;
    B(m, m) = 1-pow(sigma_*s, 2)*nu*0.5-r_*dt*0.5;
    P(m, 0) = ((K_-s > 0) ? (K_-s) : 0);

    C = inverse(A);//operator=
    C = mul(C, B);

    for(k = 1; k <= n; k++){
        P = mul(C, P);
        P(m, 0) = 0;
        P(0, 0) = ((K_*exp(-r_*(T_-k*dt))-s > 0) ? (K_*exp(-r_*(T_-k*dt))-s) : 0);
    }
    return P;
}